

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int sexp_bignum_zerop(sexp a)

{
  sexp_uint_t *data;
  int i;
  sexp a_local;
  
  i = (int)(a->value).string.offset;
  do {
    i = i + -1;
    if (i < 0) {
      return 1;
    }
  } while (*(long *)((long)&a->value + (long)i * 8 + 0x10) == 0);
  return 0;
}

Assistant:

int sexp_bignum_zerop (sexp a) {
  int i;
  sexp_uint_t *data = sexp_bignum_data(a);
  for (i=sexp_bignum_length(a)-1; i>=0; i--)
    if (data[i])
      return 0;
  return 1;
}